

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O3

bool __thiscall
draco::AttributeQuantizationTransform::SetParameters
          (AttributeQuantizationTransform *this,int quantization_bits,float *min_values,
          int num_components,float range)

{
  if (quantization_bits - 1U < 0x1e) {
    this->quantization_bits_ = quantization_bits;
    std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
              ((vector<float,std::allocator<float>> *)&this->min_values_,min_values,
               min_values + num_components);
    this->range_ = range;
  }
  return quantization_bits - 1U < 0x1e;
}

Assistant:

bool AttributeQuantizationTransform::SetParameters(int quantization_bits,
                                                   const float *min_values,
                                                   int num_components,
                                                   float range) {
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;
  min_values_.assign(min_values, min_values + num_components);
  range_ = range;
  return true;
}